

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# histogram.cpp
# Opt level: O1

void duckdb::
     HistogramFunction<duckdb::StringMapType<duckdb::OwningStringMap<unsigned_long,std::map<duckdb::string_t,unsigned_long,std::less<duckdb::string_t>,std::allocator<std::pair<duckdb::string_t_const,unsigned_long>>>>>>
     ::
     Combine<duckdb::HistogramAggState<duckdb::string_t,duckdb::OwningStringMap<unsigned_long,std::map<duckdb::string_t,unsigned_long,std::less<duckdb::string_t>,std::allocator<std::pair<duckdb::string_t_const,unsigned_long>>>>>,duckdb::HistogramFunction<duckdb::StringMapType<duckdb::OwningStringMap<unsigned_long,std::map<duckdb::string_t,unsigned_long,std::less<duckdb::string_t>,std::allocator<std::pair<duckdb::string_t_const,unsigned_long>>>>>>>
               (HistogramAggState<duckdb::string_t,_duckdb::OwningStringMap<unsigned_long,_std::map<duckdb::string_t,_unsigned_long,_std::less<duckdb::string_t>,_std::allocator<std::pair<const_duckdb::string_t,_unsigned_long>_>_>_>_>
                *source,HistogramAggState<duckdb::string_t,_duckdb::OwningStringMap<unsigned_long,_std::map<duckdb::string_t,_unsigned_long,_std::less<duckdb::string_t>,_std::allocator<std::pair<const_duckdb::string_t,_unsigned_long>_>_>_>_>
                        *target,AggregateInputData *input_data)

{
  _Rb_tree_header *p_Var1;
  ArenaAllocator *pAVar2;
  _Base_ptr p_Var3;
  OwningStringMap<unsigned_long,_std::map<duckdb::string_t,_unsigned_long,_std::less<duckdb::string_t>,_std::allocator<std::pair<const_duckdb::string_t,_unsigned_long>_>_>_>
  *pOVar4;
  mapped_type *pmVar5;
  _Rb_tree_node_base *p_Var6;
  
  if (source->hist !=
      (OwningStringMap<unsigned_long,_std::map<duckdb::string_t,_unsigned_long,_std::less<duckdb::string_t>,_std::allocator<std::pair<const_duckdb::string_t,_unsigned_long>_>_>_>
       *)0x0) {
    if (target->hist ==
        (OwningStringMap<unsigned_long,_std::map<duckdb::string_t,_unsigned_long,_std::less<duckdb::string_t>,_std::allocator<std::pair<const_duckdb::string_t,_unsigned_long>_>_>_>
         *)0x0) {
      pAVar2 = input_data->allocator;
      pOVar4 = (OwningStringMap<unsigned_long,_std::map<duckdb::string_t,_unsigned_long,_std::less<duckdb::string_t>,_std::allocator<std::pair<const_duckdb::string_t,_unsigned_long>_>_>_>
                *)operator_new(0x40);
      pOVar4->allocator = &pAVar2->arena_allocator;
      p_Var1 = &(pOVar4->map)._M_t._M_impl.super__Rb_tree_header;
      (pOVar4->map)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
      (pOVar4->map)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
      (pOVar4->map)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
      (pOVar4->map)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
      (pOVar4->map)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
      pOVar4->free_type = DOES_NOT_REQUIRE_FREE;
      target->hist = pOVar4;
    }
    pOVar4 = source->hist;
    for (p_Var6 = (pOVar4->map)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
        (_Rb_tree_header *)p_Var6 != &(pOVar4->map)._M_t._M_impl.super__Rb_tree_header;
        p_Var6 = (_Rb_tree_node_base *)::std::_Rb_tree_increment(p_Var6)) {
      p_Var3 = p_Var6[1]._M_left;
      pmVar5 = OwningStringMap<unsigned_long,_std::map<duckdb::string_t,_unsigned_long,_std::less<duckdb::string_t>,_std::allocator<std::pair<const_duckdb::string_t,_unsigned_long>_>_>_>
               ::GetOrCreate(target->hist,
                             (key_type)((anon_union_16_2_67f50693_for_value *)(p_Var6 + 1))->pointer
                            );
      *pmVar5 = (long)&p_Var3->_M_color + *pmVar5;
    }
  }
  return;
}

Assistant:

static void Combine(const STATE &source, STATE &target, AggregateInputData &input_data) {
		if (!source.hist) {
			return;
		}
		if (!target.hist) {
			target.hist = MAP_TYPE::CreateEmpty(input_data.allocator);
		}
		for (auto &entry : *source.hist) {
			(*target.hist)[entry.first] += entry.second;
		}
	}